

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_index.cpp
# Opt level: O0

void __thiscall BamTools::IndexTool::~IndexTool(IndexTool *this)

{
  _func_int **pp_Var1;
  IndexToolPrivate *this_00;
  AbstractTool *in_RDI;
  
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__IndexTool_0033f018;
  pp_Var1 = in_RDI[1]._vptr_AbstractTool;
  if (pp_Var1 != (_func_int **)0x0) {
    IndexSettings::~IndexSettings((IndexSettings *)0x21d33a);
    operator_delete(pp_Var1);
  }
  in_RDI[1]._vptr_AbstractTool = (_func_int **)0x0;
  this_00 = (IndexToolPrivate *)in_RDI[2]._vptr_AbstractTool;
  if (this_00 != (IndexToolPrivate *)0x0) {
    IndexToolPrivate::~IndexToolPrivate(this_00);
    operator_delete(this_00);
  }
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  AbstractTool::~AbstractTool(in_RDI);
  return;
}

Assistant:

IndexTool::~IndexTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}